

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

void __thiscall ELFIO::elfio::elfio(elfio *this)

{
  elfio *this_local;
  
  Sections::Sections(&this->sections,this);
  Segments::Segments(&this->segments,this);
  std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>::
  unique_ptr<std::default_delete<std::ifstream>,void>
            ((unique_ptr<std::ifstream,std::default_delete<std::ifstream>> *)&this->pstream,
             (nullptr_t)0x0);
  std::unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>>::
  unique_ptr<std::default_delete<ELFIO::elf_header>,void>
            ((unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>> *)&this->header,
             (nullptr_t)0x0);
  std::
  vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ::vector(&this->sections_);
  std::
  vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ::vector(&this->segments_);
  endianness_convertor::endianness_convertor(&this->convertor);
  address_translator::address_translator(&this->addr_translator);
  std::shared_ptr<ELFIO::compression_interface>::shared_ptr(&this->compression,(nullptr_t)0x0);
  this->current_file_pos = 0;
  create(this,'\x01','\x01');
  return;
}

Assistant:

elfio() noexcept : sections( this ), segments( this )
    {
        create( ELFCLASS32, ELFDATA2LSB );
    }